

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O3

void __thiscall
ScenePreprocessorTest_testMeshPreprocessingPos_Test::TestBody
          (ScenePreprocessorTest_testMeshPreprocessingPos_Test *this)

{
  bool bVar1;
  uint uVar2;
  aiMesh *p;
  undefined8 *puVar3;
  aiVector3D *paVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  AssertionResult gtest_ar;
  Message local_48;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  p = (aiMesh *)operator_new(0x520);
  p->mPrimitiveTypes = 0;
  p->mNumVertices = 0;
  memset(&p->mVertices,0,0xcc);
  p->mBones = (aiBone **)0x0;
  p->mMaterialIndex = 0;
  (p->mName).length = 0;
  (p->mName).data[0] = '\0';
  memset((p->mName).data + 1,0x1b,0x3ff);
  p->mNumAnimMeshes = 0;
  p->mAnimMeshes = (aiAnimMesh **)0x0;
  p->mMethod = 0;
  (p->mAABB).mMin.x = 0.0;
  (p->mAABB).mMin.y = 0.0;
  (p->mAABB).mMin.z = 0.0;
  (p->mAABB).mMax.x = 0.0;
  (p->mAABB).mMax.y = 0.0;
  (p->mAABB).mMax.z = 0.0;
  memset(p->mColors,0,0xa0);
  p->mNumFaces = 100;
  puVar3 = (undefined8 *)operator_new__(0x648);
  *puVar3 = 100;
  lVar5 = 0x10;
  do {
    *(undefined4 *)((long)puVar3 + lVar5 + -8) = 0;
    *(undefined8 *)((long)puVar3 + lVar5) = 0;
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x650);
  p->mFaces = (aiFace *)(puVar3 + 1);
  paVar4 = (aiVector3D *)operator_new__(0x78);
  paVar4->x = 0.0;
  paVar4->y = 0.0;
  *(undefined8 *)&paVar4->z = 0;
  paVar4[1].y = 0.0;
  paVar4[1].z = 0.0;
  paVar4[2].x = 0.0;
  paVar4[2].y = 0.0;
  *(undefined8 *)&paVar4[2].z = 0;
  paVar4[3].y = 0.0;
  paVar4[3].z = 0.0;
  paVar4[4].x = 0.0;
  paVar4[4].y = 0.0;
  *(undefined8 *)&paVar4[4].z = 0;
  paVar4[5].y = 0.0;
  paVar4[5].z = 0.0;
  paVar4[6].x = 0.0;
  paVar4[6].y = 0.0;
  *(undefined8 *)&paVar4[6].z = 0;
  paVar4[7].y = 0.0;
  paVar4[7].z = 0.0;
  paVar4[8].x = 0.0;
  paVar4[8].y = 0.0;
  *(undefined8 *)&paVar4[8].z = 0;
  uVar7 = 0;
  paVar4[9].y = 0.0;
  paVar4[9].z = 0.0;
  p->mTextureCoords[0] = paVar4;
  p->mNumUVComponents[0] = 0;
  p->mNumUVComponents[1] = 0;
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,1,1);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,2,2);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,3,4);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,4,8);
  ScenePreprocessorTest::CheckIfOnly(&this->super_ScenePreprocessorTest,p,0x4e1,8);
  uVar2 = p->mNumFaces;
  if (1 < uVar2) {
    lVar5 = 0;
    uVar7 = 0;
    do {
      *(undefined4 *)((long)&p->mFaces->mNumIndices + lVar5) = 3;
      uVar7 = uVar7 + 1;
      uVar2 = p->mNumFaces;
      lVar5 = lVar5 + 0x10;
    } while (uVar7 < uVar2 >> 1);
  }
  if ((uint)uVar7 < uVar2 - (uVar2 >> 2)) {
    uVar7 = uVar7 & 0xffffffff;
    lVar5 = uVar7 << 4;
    do {
      *(undefined4 *)((long)&p->mFaces->mNumIndices + lVar5) = 4;
      uVar7 = uVar7 + 1;
      uVar2 = p->mNumFaces;
      lVar5 = lVar5 + 0x10;
    } while (uVar7 < uVar2 - (uVar2 >> 2));
  }
  if ((uint)uVar7 < uVar2) {
    uVar7 = uVar7 & 0xffffffff;
    lVar5 = uVar7 << 4;
    do {
      *(undefined4 *)((long)&p->mFaces->mNumIndices + lVar5) = 10;
      uVar7 = uVar7 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar7 < p->mNumFaces);
  }
  Assimp::ScenePreprocessor::ProcessMesh((this->super_ScenePreprocessorTest).mScenePreprocessor,p);
  local_48.ss_.ptr_._0_4_ = 0xc;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_38,"static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON)",
             "p->mPrimitiveTypes",(uint *)&local_48,(uint *)p);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8c,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ss_.ptr_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_38,"2U","p->mNumUVComponents[0]",(uint *)&local_48,p->mNumUVComponents);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_38,"0U","p->mNumUVComponents[1]",(uint *)&local_48,p->mNumUVComponents + 1);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message(&local_48);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utScenePreprocessor.cpp"
               ,0x8e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_48.ss_.ptr_._4_4_,local_48.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  aiMesh::~aiMesh(p);
  operator_delete(p);
  return;
}

Assistant:

TEST_F(ScenePreprocessorTest, testMeshPreprocessingPos) {
    aiMesh* p = new aiMesh;
    p->mNumFaces = 100;
    p->mFaces = new aiFace[p->mNumFaces];

    p->mTextureCoords[0] = new aiVector3D[10];
    p->mNumUVComponents[0] = 0;
    p->mNumUVComponents[1] = 0;

    CheckIfOnly(p,1,aiPrimitiveType_POINT);
    CheckIfOnly(p,2,aiPrimitiveType_LINE);
    CheckIfOnly(p,3,aiPrimitiveType_TRIANGLE);
    CheckIfOnly(p,4,aiPrimitiveType_POLYGON);
    CheckIfOnly(p,1249,aiPrimitiveType_POLYGON);

    // Polygons and triangles mixed
    unsigned i;
    for (i = 0; i < p->mNumFaces/2;++i) {
        p->mFaces[i].mNumIndices = 3;
    }
    for (; i < p->mNumFaces-p->mNumFaces/4;++i) {
        p->mFaces[i].mNumIndices = 4;
    }
    for (; i < p->mNumFaces;++i)    {
        p->mFaces[i].mNumIndices = 10;
    }
    ProcessMesh(p);
    EXPECT_EQ(static_cast<unsigned int>(aiPrimitiveType_TRIANGLE|aiPrimitiveType_POLYGON),
              p->mPrimitiveTypes);
    EXPECT_EQ(2U, p->mNumUVComponents[0]);
    EXPECT_EQ(0U, p->mNumUVComponents[1]);
    delete p;
}